

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O0

int __thiscall libchars::terminal_driver::initialize__(terminal_driver *this,int fd_in,int fd_out)

{
  int iVar1;
  debug *pdVar2;
  double __x;
  double __x_00;
  char *local_80;
  size_t local_70;
  size_t y;
  size_t x;
  undefined4 local_58;
  termios new_termios;
  char *term_tty_name;
  int fd_out_local;
  int fd_in_local;
  terminal_driver *this_local;
  
  pdVar2 = debug::initialize(0);
  debug::log(pdVar2,__x);
  this->fd_r = fd_in;
  this->fd_w = fd_out;
  if ((-1 < this->fd_r) && (-1 < this->fd_w)) {
    iVar1 = isatty(this->fd_r);
    this->is_tty = iVar1 != 0;
    if ((this->is_tty & 1U) == 0) {
      local_80 = "-";
    }
    else {
      local_80 = ttyname(this->fd_r);
    }
    new_termios._52_8_ = local_80;
    pdVar2 = debug::initialize(0);
    debug::log(pdVar2,__x_00);
    tcgetattr(this->fd_r,(termios *)this);
    tcgetattr(this->fd_r,(termios *)((long)&x + 4));
    x._4_4_ = 0;
    local_58 = 5;
    new_termios.c_oflag = 0;
    new_termios.c_lflag._3_1_ = 1;
    new_termios.c_lflag._2_1_ = 0;
    tcsetattr(this->fd_r,1,(termios *)((long)&x + 4));
    if ((this->is_tty & 1U) != 0) {
      iVar1 = cursor_position(this,&y,&local_70,2000);
      this->control_enabled = -1 < iVar1;
      if ((this->control_enabled & 1U) == 0) {
        newline(this);
      }
      get_terminal_width_and_height(this);
    }
  }
  return 0;
}

Assistant:

int terminal_driver::initialize__(int fd_in, int fd_out)
    {
        LC_LOG_DEBUG("START:%d,%d",fd_in,fd_out);
        fd_r = fd_in;
        fd_w = fd_out;

        if (fd_r >= 0 && fd_w >= 0) {
            // read terminal settings
            is_tty = isatty(fd_r);
            const char *term_tty_name = is_tty ? ttyname(fd_r) : "-";
            LC_LOG_DEBUG("INIT:%s",term_tty_name);

            (void)tcgetattr(fd_r, &original_termios);

            // put terminal in raw mode
            struct termios new_termios;
            (void)tcgetattr(fd_r, &new_termios);
            new_termios.c_iflag = 0;
            new_termios.c_oflag = OPOST | ONLCR;
            new_termios.c_lflag = 0;
            new_termios.c_cc[VMIN] = 1;
            new_termios.c_cc[VTIME] = 0;
            (void)tcsetattr(fd_r, TCSADRAIN, &new_termios);

            if (is_tty) {
                // auto-disable control sequences if cursor position reply not seen before timeout
                size_t x,y;
                control_enabled = (cursor_position(x,y,LC_CONTROL_CHECK_TIMEOUT_ms) >= 0);
                if (!control_enabled) 
                    newline();
                get_terminal_width_and_height(); 
            }
        }
        return 0;
    }